

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O3

ACES * __thiscall
AS_02::ACES::CreateTargetFrameAssetId(ACES *this,UUID *rID,string *target_frame_file)

{
  uint uVar1;
  size_t __size;
  uint *__ptr;
  byte_t bin_buf [20];
  FileReader reader;
  SHA1_CTX ctx;
  undefined4 local_d8;
  undefined2 local_d4;
  byte local_d2;
  byte_t local_d1;
  byte local_d0;
  undefined4 local_cf;
  undefined3 uStack_cb;
  FileReader local_b8 [48];
  SHA1_CTX local_88;
  
  Kumu::FileReader::FileReader(local_b8);
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  Kumu::FileReader::OpenRead((string *)&local_88);
  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_88);
  Kumu::Result_t::~Result_t((Result_t *)&local_88);
  if (-1 < *(int *)this) {
    __size = Kumu::FileReader::Size();
    __ptr = (uint *)malloc(__size);
    if (__ptr == (uint *)0x0) {
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
    }
    else {
      Kumu::FileReader::Size();
      Kumu::FileReader::Read((uchar *)&local_88,(uint)local_b8,__ptr);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_88);
      Kumu::Result_t::~Result_t((Result_t *)&local_88);
      uVar1 = Kumu::FileReader::Size();
      Kumu::SHA1_Init(&local_88);
      Kumu::SHA1_Update(&local_88,s_ns_id_target_frame_prefix,0x10);
      Kumu::SHA1_Update(&local_88,(uchar *)__ptr,uVar1);
      Kumu::SHA1_Final((uchar *)&local_d8,&local_88);
      (rID->super_Identifier<16U>).m_HasValue = true;
      *(undefined4 *)(rID->super_Identifier<16U>).m_Value = local_d8;
      *(undefined2 *)((rID->super_Identifier<16U>).m_Value + 4) = local_d4;
      (rID->super_Identifier<16U>).m_Value[6] = local_d2 & 0xf | 0x50;
      (rID->super_Identifier<16U>).m_Value[7] = local_d1;
      (rID->super_Identifier<16U>).m_Value[8] = local_d0 & 0x3f | 0x80;
      *(undefined4 *)((rID->super_Identifier<16U>).m_Value + 9) = local_cf;
      *(uint *)((rID->super_Identifier<16U>).m_Value + 0xc) = CONCAT31(uStack_cb,local_cf._3_1_);
      free(__ptr);
    }
  }
  Kumu::FileReader::~FileReader(local_b8);
  return this;
}

Assistant:

AS_02::Result_t
AS_02::ACES::CreateTargetFrameAssetId(Kumu::UUID& rID, const std::string& target_frame_file)
{
  Kumu::FileReader reader;
  Result_t result = Kumu::RESULT_OK;
  result = reader.OpenRead(target_frame_file);
  if (KM_SUCCESS(result))
  {
    byte_t* read_buffer = (byte_t*)malloc(reader.Size());
    if (read_buffer)
    {
      result = reader.Read(read_buffer, reader.Size());
      rID = AS_02::ACES::create_4122_type5_id(read_buffer, reader.Size(), s_ns_id_target_frame_prefix);
      free(read_buffer);
    } else result = Kumu::RESULT_FAIL;
  }
  return result;
}